

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

bool __thiscall
helics::TimeDependencies::checkIfReadyForExecEntry
          (TimeDependencies *this,bool iterating,bool waiting)

{
  pointer pDVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  DependencyInfo *pDVar5;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  _Var6;
  undefined7 in_register_00000031;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  __last;
  DependencyInfo *pDVar7;
  
  if ((int)CONCAT71(in_register_00000031,iterating) == 0) {
    if (waiting) {
      bVar2 = checkIfAllDependenciesArePastExec(this,false);
      return bVar2;
    }
    pDVar1 = (this->dependencies).
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->dependencies).
         super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl
         .super__Vector_impl_data._M_finish;
    lVar4 = (long)__last._M_current - (long)pDVar1;
    pDVar7 = pDVar1 + 2;
    for (lVar3 = lVar4 / 0x58 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
      if (((pDVar7[-2].dependency == true) &&
          (pDVar7[-2].super_TimeData.mTimeState < exec_requested)) &&
         (pDVar7[-2].connection != SELF)) goto LAB_002d8582;
      if (((pDVar7[-1].dependency == true) &&
          (pDVar7[-1].super_TimeData.mTimeState < exec_requested)) &&
         (pDVar7[-1].connection != SELF)) goto LAB_002d858b;
      if (((pDVar7->dependency == true) && ((pDVar7->super_TimeData).mTimeState < exec_requested))
         && (_Var6._M_current = pDVar7, pDVar7->connection != SELF)) goto LAB_002d8598;
      if (((pDVar7[1].dependency == true) && (pDVar7[1].super_TimeData.mTimeState < exec_requested))
         && (pDVar7[1].connection != SELF)) goto LAB_002d8591;
      pDVar7 = pDVar7 + 4;
      lVar4 = lVar4 + -0x160;
    }
    lVar4 = lVar4 / 0x58;
    pDVar5 = pDVar7 + -2;
    if (lVar4 != 1) {
      if (lVar4 == 3) {
        if (((pDVar7[-2].dependency == true) &&
            (pDVar7[-2].super_TimeData.mTimeState < exec_requested)) &&
           (_Var6._M_current = pDVar5, pDVar7[-2].connection != SELF)) goto LAB_002d8598;
        pDVar5 = pDVar7 + -1;
      }
      else {
        _Var6._M_current = __last._M_current;
        if (lVar4 != 2) goto LAB_002d8598;
      }
      if (((pDVar5->dependency == true) && ((pDVar5->super_TimeData).mTimeState < exec_requested))
         && (_Var6._M_current = pDVar5, pDVar5->connection != SELF)) goto LAB_002d8598;
      pDVar5 = pDVar5 + 1;
    }
    _Var6._M_current = __last._M_current;
    if (((pDVar5->dependency == true) && ((pDVar5->super_TimeData).mTimeState < exec_requested)) &&
       (_Var6._M_current = pDVar5, pDVar5->connection == SELF)) {
      _Var6._M_current = __last._M_current;
    }
  }
  else {
    _Var6._M_current =
         (this->dependencies).
         super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl
         .super__Vector_impl_data._M_start;
    __last._M_current =
         (this->dependencies).
         super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (waiting) {
      bVar2 = std::
              all_of<__gnu_cxx::__normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,bool(*)(helics::DependencyInfo_const&)>
                        (_Var6,__last,iteratingWaitingDependencyCheck);
      return bVar2;
    }
    lVar4 = (long)__last._M_current - (long)_Var6._M_current;
    pDVar7 = _Var6._M_current + 2;
    for (lVar3 = lVar4 / 0x58 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
      if ((pDVar7[-2].dependency == true) && (pDVar7[-2].super_TimeData.mTimeState == initialized))
      goto LAB_002d8582;
      if ((pDVar7[-1].dependency == true) && (pDVar7[-1].super_TimeData.mTimeState == initialized))
      goto LAB_002d858b;
      if ((pDVar7->dependency == true) &&
         (_Var6._M_current = pDVar7, (pDVar7->super_TimeData).mTimeState == initialized))
      goto LAB_002d8598;
      if ((pDVar7[1].dependency == true) && (pDVar7[1].super_TimeData.mTimeState == initialized))
      goto LAB_002d8591;
      pDVar7 = pDVar7 + 4;
      lVar4 = lVar4 + -0x160;
    }
    lVar4 = lVar4 / 0x58;
    pDVar5 = pDVar7 + -2;
    if (lVar4 != 1) {
      if (lVar4 == 3) {
        if ((pDVar7[-2].dependency == true) &&
           (_Var6._M_current = pDVar5, pDVar7[-2].super_TimeData.mTimeState == initialized))
        goto LAB_002d8598;
        pDVar5 = pDVar7 + -1;
      }
      else {
        _Var6._M_current = __last._M_current;
        if (lVar4 != 2) goto LAB_002d8598;
      }
      if ((pDVar5->dependency == true) &&
         (_Var6._M_current = pDVar5, (pDVar5->super_TimeData).mTimeState == initialized))
      goto LAB_002d8598;
      pDVar5 = pDVar5 + 1;
    }
    _Var6._M_current = __last._M_current;
    if ((pDVar5->super_TimeData).mTimeState == initialized) {
      _Var6._M_current = pDVar5;
    }
    if (pDVar5->dependency == false) {
      _Var6._M_current = __last._M_current;
    }
  }
  goto LAB_002d8598;
LAB_002d8582:
  _Var6._M_current = pDVar7 + -2;
  goto LAB_002d8598;
LAB_002d858b:
  _Var6._M_current = pDVar7 + -1;
  goto LAB_002d8598;
LAB_002d8591:
  _Var6._M_current = pDVar7 + 1;
LAB_002d8598:
  return _Var6._M_current == __last._M_current;
}

Assistant:

bool TimeDependencies::checkIfReadyForExecEntry(bool iterating, bool waiting) const
{
    if (iterating) {
        if (waiting) {
            return std::all_of(dependencies.begin(),
                               dependencies.end(),
                               iteratingWaitingDependencyCheck);
        }
        return std::none_of(dependencies.begin(), dependencies.end(), [](const auto& dep) {
            return (dep.dependency && dep.mTimeState == TimeState::initialized);
        });
    }
    if (waiting) {
        return checkIfAllDependenciesArePastExec(false);
    }
    return std::none_of(dependencies.begin(), dependencies.end(), [](const auto& dep) {
        return (dep.dependency &&
                (!(dep.mTimeState >= TimeState::exec_requested ||
                   (dep.connection == ConnectionType::SELF &&
                    dep.mTimeState >= TimeState::initialized))));
    });
}